

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

void __thiscall re2::Compiler::AddRuneRangeLatin1(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  int id;
  
  if (0xff < lo || hi < lo) {
    return;
  }
  if (0xfe < hi) {
    hi = 0xff;
  }
  id = UncachedRuneByteSuffix(this,(uint8)lo,(uint8)hi,foldcase,0);
  AddSuffix(this,id);
  return;
}

Assistant:

void Compiler::AddRuneRangeLatin1(Rune lo, Rune hi, bool foldcase) {
  // Latin-1 is easy: runes *are* bytes.
  if (lo > hi || lo > 0xFF)
    return;
  if (hi > 0xFF)
    hi = 0xFF;
  AddSuffix(UncachedRuneByteSuffix(static_cast<uint8>(lo),
                                   static_cast<uint8>(hi), foldcase, 0));
}